

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O1

FunctionRegistrator * anon_unknown.dwarf_157a39::FunctionRegistrator::instance(void)

{
  undefined1 extraout_AL;
  undefined7 in_register_00000001;
  undefined7 extraout_var;
  
  if ((anonymous_namespace)::FunctionRegistrator::instance()::registrator != '\0') {
    return (FunctionRegistrator *)
           CONCAT71(in_register_00000001,
                    (anonymous_namespace)::FunctionRegistrator::instance()::registrator);
  }
  _GLOBAL__N_1::FunctionRegistrator::instance();
  return (FunctionRegistrator *)CONCAT71(extraout_var,extraout_AL);
}

Assistant:

static FunctionRegistrator& instance()
        {
            static FunctionRegistrator registrator;
            return registrator;
        }